

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O3

PDFRectangle * __thiscall
PDFDocumentHandler::DeterminePageBox
          (PDFRectangle *__return_storage_ptr__,PDFDocumentHandler *this,PDFDictionary *inDictionary
          ,EPDFPageBox inPageBoxType)

{
  PDFPageInput pageInput;
  PDFPageInput PStack_58;
  PDFRectangle local_40;
  
  PDFRectangle::PDFRectangle(__return_storage_ptr__);
  RefCountObject::AddRef((RefCountObject *)inDictionary);
  PDFPageInput::PDFPageInput(&PStack_58,this->mParser,&inDictionary->super_PDFObject);
  switch(inPageBoxType) {
  case ePDFPageBoxMediaBox:
    PDFPageInput::GetMediaBox(&local_40,&PStack_58);
    break;
  case ePDFPageBoxCropBox:
    PDFPageInput::GetCropBox(&local_40,&PStack_58);
    break;
  case ePDFPageBoxBleedBox:
    PDFPageInput::GetBleedBox(&local_40,&PStack_58);
    break;
  case ePDFPageBoxTrimBox:
    PDFPageInput::GetTrimBox(&local_40,&PStack_58);
    break;
  case ePDFPageBoxArtBox:
    PDFPageInput::GetArtBox(&local_40,&PStack_58);
    break;
  default:
    goto switchD_001c5e71_default;
  }
  __return_storage_ptr__->UpperRightX = local_40.UpperRightX;
  __return_storage_ptr__->UpperRightY = local_40.UpperRightY;
  __return_storage_ptr__->LowerLeftX = local_40.LowerLeftX;
  __return_storage_ptr__->LowerLeftY = local_40.LowerLeftY;
  PDFRectangle::~PDFRectangle(&local_40);
switchD_001c5e71_default:
  PDFPageInput::~PDFPageInput(&PStack_58);
  return __return_storage_ptr__;
}

Assistant:

PDFRectangle PDFDocumentHandler::DeterminePageBox(PDFDictionary* inDictionary,EPDFPageBox inPageBoxType)
{
	PDFRectangle result;
    inDictionary->AddRef();
    PDFPageInput pageInput(mParser,inDictionary);

	switch(inPageBoxType)
	{
		case ePDFPageBoxMediaBox:
			result = pageInput.GetMediaBox();
            break;
		case ePDFPageBoxCropBox:
		{
            result = pageInput.GetCropBox();
			break;
		}
		case ePDFPageBoxBleedBox:
		{
            result = pageInput.GetBleedBox();
			break;
		}
		case ePDFPageBoxTrimBox:
		{
            result = pageInput.GetTrimBox();
			break;
		}
		case ePDFPageBoxArtBox:
		{
            result = pageInput.GetArtBox();
			break;
		}
	}
	return result;
}